

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O1

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedObjGradient<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>
          (NLW2_NLFeeder_C_Impl *this,int i,SingleSparseVecWrtFactory<int,_double> *svwf)

{
  int iVar1;
  function<void_(int,_double)> svw;
  SparseVectorWriter<int,_double> sv;
  SingleSparseVecWrtFactory<int,_double> *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  iVar1 = (*(this->nlf2_c_).ObjGradientNNZ)((this->nlf2_c_).p_user_data_,i);
  if (iVar1 != 0) {
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd0,(size_t)svwf);
    uStack_50 = 0;
    pcStack_40 = std::
                 _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:135:13)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:135:13)>
               ::_M_manager;
    local_58 = (SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd0;
    (*(this->nlf2_c_).FeedObjGradient)((this->nlf2_c_).p_user_data_,i,&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
  }
  return;
}

Assistant:

void FeedObjGradient(int i, ObjGradWriterFactory& svwf) {
    assert(NLF().ObjGradientNNZ);
    int nnz = NLF().ObjGradientNNZ(NLF().p_user_data_, i);
    if (nnz) {
      auto sv = svwf.MakeVectorWriter(nnz);
      assert(NLF().FeedObjGradient);
      // We need the callback to be callable from C.
      // Due to the NLWriter2 having different types
      // for text vs binary, static functions won't work.
      std::function<void(int, double)> svw
          = [&sv](int i, double v){
        sv.Write(i, v);
      };
      NLF().FeedObjGradient(NLF().p_user_data_, i, &svw);
    }
  }